

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spreadhash.cpp
# Opt level: O0

uint64_t SS_AwareHash_debug(uchar *data,uint64_t n,uint64_t hash,uint64_t scale,uint64_t hardener)

{
  long in_RCX;
  ulong in_RDX;
  long in_RSI;
  byte *in_RDI;
  ulong in_R8;
  ulong local_18;
  long local_10;
  byte *local_8;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  while (local_10 != 0) {
    fprintf(_stderr,"    %lu %lu %lu %u\n",local_10,local_18,in_RCX,(ulong)*local_8);
    local_18 = (ulong)*local_8 + in_RCX * local_18;
    local_10 = local_10 + -1;
    fprintf(_stderr,"        internal %lu\n",local_18);
    local_8 = local_8 + 1;
  }
  return local_18 ^ in_R8;
}

Assistant:

uint64_t SS_AwareHash_debug(unsigned char* data, uint64_t n,
	uint64_t hash, uint64_t scale, uint64_t hardener) {
	while (n) {
		fprintf(stderr, "    %lu %lu %lu %u\n", n, hash, scale, *data);
		hash *= scale;
		hash += *data++;
		n--;
		fprintf(stderr, "        internal %lu\n", hash);
	}
	return hash ^ hardener;
}